

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.hpp
# Opt level: O2

Writer * __thiscall
xe::xml::Writer::operator<<
          (Writer *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  if (this->m_state == STATE_ELEMENT) {
    std::operator<<(this->m_rawDst,">");
  }
  std::operator<<(&this->m_dataStr,(string *)value);
  this->m_state = STATE_DATA;
  return this;
}

Assistant:

Writer& Writer::operator<< (const T& value)
{
	if (m_state == STATE_ELEMENT)
		m_rawDst << ">";

	m_dataStr << value;
	m_state = STATE_DATA;

	return *this;
}